

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cc
# Opt level: O0

void re2c::Range::append_overlapping(Range **head,Range **tail,Range *r)

{
  Range *pRVar1;
  Range *r_local;
  Range **tail_local;
  Range **head_local;
  
  if (*head == (Range *)0x0) {
    pRVar1 = ran(r->lb,r->ub);
    *head = pRVar1;
    *tail = *head;
  }
  else if ((*tail)->ub < r->lb) {
    pRVar1 = ran(r->lb,r->ub);
    (*tail)->nx = pRVar1;
    *tail = (*tail)->nx;
  }
  else if ((*tail)->ub < r->ub) {
    (*tail)->ub = r->ub;
  }
  return;
}

Assistant:

void Range::append_overlapping (Range * & head, Range * & tail, const Range * r)
{
	if (!head)
	{
		head = Range::ran (r->lb, r->ub);
		tail = head;
	}
	else if (tail->ub < r->lb)
	{
		tail->nx = Range::ran (r->lb, r->ub);
		tail = tail->nx;
	}
	else if (tail->ub < r->ub)
	{
		tail->ub = r->ub;
	}
}